

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::rejectLeave
          (SPxSolverBase<double> *this,int leaveNum,SPxId leaveId,Status leaveStat,
          SVectorBase<double> *param_4)

{
  long lVar1;
  Status *pSVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  lVar1 = (long)leaveNum;
  if (leaveId.super_DataKey.info < 0) {
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_001c32e2;
    bVar7 = pSVar2[lVar1] == P_ON_LOWER;
    lVar3 = 0x610;
    lVar6 = 0x628;
    lVar5 = 0x628;
  }
  else {
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_001c32e2;
    bVar7 = pSVar2[lVar1] == P_ON_UPPER;
    lVar3 = 0x640;
    lVar6 = 0x658;
    lVar5 = 0x658;
  }
  lVar4 = lVar3;
  if (bVar7) {
    lVar4 = lVar6;
    lVar5 = lVar3;
  }
  *(undefined8 *)
   (*(long *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                     _vptr_ClassArray + lVar4) + lVar1 * 8) =
       *(undefined8 *)
        (*(long *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                          super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                          _vptr_ClassArray + lVar5) + lVar1 * 8);
LAB_001c32e2:
  pSVar2[lVar1] = leaveStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectLeave(
   int leaveNum,
   SPxId leaveId,
   typename SPxBasisBase<R>::Desc::Status leaveStat,
   const SVectorBase<R>* //newVec
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(leaveId.isSPxRowId())
   {
      SPxOut::debug(this, "DLEAVE58 rejectLeave()  : row {}: {} -> {}\n", leaveNum,
                    ds.rowStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.rowStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_LOWER)
            theLRbound[leaveNum] = theURbound[leaveNum];
         else
            theURbound[leaveNum] = theLRbound[leaveNum];
      }

      ds.rowStatus(leaveNum) = leaveStat;
   }
   else
   {
      SPxOut::debug(this, "DLEAVE59 rejectLeave()  : col {}: {} -> {}\n", leaveNum,
                    ds.colStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.colStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_UPPER)
            theLCbound[leaveNum] = theUCbound[leaveNum];
         else
            theUCbound[leaveNum] = theLCbound[leaveNum];
      }

      ds.colStatus(leaveNum) = leaveStat;
   }
}